

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O0

void Omega_h::compute_ill_metric_dim<2>(Mesh *mesh,AdaptOpts *opts,Omega_h_Isotropy isotropy)

{
  AdaptOpts *pAVar1;
  LO LVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined1 local_4a0 [40];
  string local_478 [39];
  allocator local_451;
  string local_450 [32];
  Read<double> local_430;
  Read<double> local_420;
  Read<double> local_410;
  allocator local_3f9;
  string local_3f8 [39];
  allocator local_3d1;
  string local_3d0 [32];
  Read<double> local_3b0;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [32];
  Read<double> local_350;
  Read<double> local_340;
  Read<double> local_330;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  Write<double> local_2d0;
  Read<double> local_2c0;
  undefined1 local_2b0 [8];
  type f;
  string local_278 [32];
  Read<double> local_258;
  undefined1 local_248 [8];
  Write<double> elem_metrics_w;
  Real min_qual;
  string local_228 [32];
  undefined1 local_208 [8];
  Read<double> prelim_quals;
  string local_1d0 [32];
  Read<double> local_1b0;
  Read<double> local_1a0;
  int local_18c;
  undefined1 local_188 [4];
  Int i;
  undefined1 local_178 [8];
  Reals metrics;
  string local_150 [36];
  int local_12c;
  undefined1 local_128 [4];
  int ncomps;
  Read<double> local_118;
  undefined1 local_108 [8];
  Reals elem_metrics;
  allocator local_e1;
  string local_e0 [36];
  Omega_h_Isotropy local_bc;
  AdaptOpts *pAStack_b8;
  Omega_h_Isotropy isotropy_local;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  Alloc *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Alloc *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Alloc *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  Alloc *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Mesh *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Alloc *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Alloc *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  Alloc *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  Alloc *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  local_bc = isotropy;
  pAStack_b8 = opts;
  opts_local = (AdaptOpts *)mesh;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"metric",&local_e1);
  Mesh::remove_tag(mesh,0,(string *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::operator<<((ostream *)&std::cout,"getting element implied metrics\n");
  get_element_implied_length_metrics((Omega_h *)local_108,(Mesh *)opts_local);
  LVar2 = Mesh::nelems((Mesh *)opts_local);
  Read<double>::Read((Read<double> *)local_128,(Read<double> *)local_108);
  apply_isotropy((Omega_h *)&local_118,LVar2,(Reals *)local_128,local_bc);
  Read<double>::operator=((Read<double> *)local_108,&local_118);
  Read<double>::~Read(&local_118);
  Read<double>::~Read((Read<double> *)local_128);
  local_88 = (Alloc *)local_108;
  if (((ulong)local_108 & 1) == 0) {
    local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_108;
  }
  else {
    local_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_108 >> 3);
  }
  uVar6 = (ulong)local_10._M_pi >> 3;
  local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88;
  local_18 = local_88;
  LVar2 = Mesh::nelems((Mesh *)opts_local);
  local_12c = divide_no_remainder<int>((int)uVar6,LVar2);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"metric",(allocator *)&stack0xfffffffffffffeaf);
  iVar5 = local_12c;
  Read<double>::Read((Read<double> *)&metrics.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_108);
  Mesh::add_tag<double>
            ((Mesh *)pAVar1,2,(string *)local_150,iVar5,
             (Read<double> *)&metrics.write_.shared_alloc_.direct_ptr,false);
  Read<double>::~Read((Read<double> *)&metrics.write_.shared_alloc_.direct_ptr);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeaf);
  std::operator<<((ostream *)&std::cout,"projecting them\n");
  pAVar1 = opts_local;
  Read<double>::Read((Read<double> *)local_188,(Read<double> *)local_108);
  project_metrics((Omega_h *)local_178,(Mesh *)pAVar1,(Reals *)local_188);
  Read<double>::~Read((Read<double> *)local_188);
  iVar5 = local_12c;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178;
  if (((ulong)local_178 & 1) == 0) {
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_178;
  }
  else {
    local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_178 >> 3);
  }
  uVar6 = (ulong)local_20._M_pi >> 3;
  local_78 = (Alloc *)local_90._M_pi;
  local_28 = (Alloc *)local_90._M_pi;
  LVar2 = Mesh::nverts((Mesh *)opts_local);
  iVar3 = divide_no_remainder<int>((int)uVar6,LVar2);
  if (iVar5 != iVar3) {
    fail("assertion %s failed at %s +%d\n",
         "ncomps == divide_no_remainder(metrics.size(), mesh->nverts())",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
         ,0x1b);
  }
  if (local_bc == OMEGA_H_ANISOTROPIC) {
    for (local_18c = 0; local_18c < 5; local_18c = local_18c + 1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"metric smoothing iteration ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_18c);
      std::operator<<(poVar7,'\n');
      pAVar1 = opts_local;
      Read<double>::Read(&local_1b0,(Read<double> *)local_178);
      smooth_metric_once((Omega_h *)&local_1a0,(Mesh *)pAVar1,&local_1b0,true);
      Read<double>::operator=((Read<double> *)local_178,&local_1a0);
      Read<double>::~Read(&local_1a0);
      Read<double>::~Read(&local_1b0);
    }
  }
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"metric",(allocator *)&stack0xfffffffffffffe2f);
  iVar5 = local_12c;
  Read<double>::Read((Read<double> *)&stack0xfffffffffffffe18,(Read<double> *)local_178);
  Mesh::add_tag<double>
            ((Mesh *)pAVar1,0,(string *)local_1d0,iVar5,(Read<double> *)&stack0xfffffffffffffe18,
             false);
  Read<double>::~Read((Read<double> *)&stack0xfffffffffffffe18);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe2f);
  std::operator<<((ostream *)&std::cout,"computing qualities\n");
  Mesh::ask_qualities((Mesh *)&prelim_quals.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&prelim_quals.write_.shared_alloc_.direct_ptr);
  pAVar1 = opts_local;
  uVar4 = Mesh::dim((Mesh *)opts_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"quality",(allocator *)((long)&min_qual + 7));
  Mesh::get_array<double>((Mesh *)local_208,(Int)pAVar1,(string *)(ulong)uVar4);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)((long)&min_qual + 7));
  elem_metrics_w.shared_alloc_.direct_ptr = (void *)pAStack_b8->min_quality_allowed;
  std::operator<<((ostream *)&std::cout,"removing low-quality contributions\n");
  Read<double>::Read(&local_258,(Read<double> *)local_108);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"",(allocator *)((long)&f.elem_metrics_w.shared_alloc_.direct_ptr + 7));
  deep_copy<double>((Omega_h *)local_248,(Read<signed_char> *)&local_258,(string *)local_278);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.elem_metrics_w.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_258);
  Read<double>::Read((Read<double> *)local_2b0,(Read<double> *)local_208);
  f.prelim_quals.write_.shared_alloc_.direct_ptr = elem_metrics_w.shared_alloc_.direct_ptr;
  f.min_qual._0_4_ = local_12c;
  Write<double>::Write((Write<double> *)&f.ncomps,(Write<double> *)local_248);
  LVar2 = Mesh::nelems((Mesh *)opts_local);
  parallel_for<Omega_h::compute_ill_metric_dim<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h_Isotropy)::_lambda(int)_1_>
            (LVar2,(type *)local_2b0,"ignore_low_quality_implied");
  Write<double>::Write(&local_2d0,(Write<double> *)local_248);
  Read<double>::Read(&local_2c0,&local_2d0);
  Read<double>::operator=((Read<double> *)local_108,&local_2c0);
  Read<double>::~Read(&local_2c0);
  Write<double>::~Write(&local_2d0);
  std::operator<<((ostream *)&std::cout,"done removing low-quality contributions\n");
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"metric",&local_2f1);
  Mesh::remove_tag((Mesh *)pAVar1,2,(string *)local_2f0);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"metric",&local_319);
  iVar5 = local_12c;
  Read<double>::Read(&local_330,(Read<double> *)local_108);
  Mesh::add_tag<double>((Mesh *)pAVar1,2,(string *)local_318,iVar5,&local_330,false);
  Read<double>::~Read(&local_330);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::operator<<((ostream *)&std::cout,"projecting metrics elem -> node\n");
  pAVar1 = opts_local;
  Read<double>::Read(&local_350,(Read<double> *)local_108);
  project_metrics((Omega_h *)&local_340,(Mesh *)pAVar1,&local_350);
  Read<double>::operator=((Read<double> *)local_178,&local_340);
  Read<double>::~Read(&local_340);
  Read<double>::~Read(&local_350);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"metric",&local_371);
  Mesh::remove_tag((Mesh *)pAVar1,0,(string *)local_370);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"metric",&local_399);
  local_98 = (Alloc *)local_178;
  if (((ulong)local_178 & 1) == 0) {
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_178;
  }
  else {
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_178 >> 3);
  }
  uVar6 = (ulong)local_30._M_pi >> 3;
  local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98;
  local_38 = local_98;
  LVar2 = Mesh::nverts((Mesh *)opts_local);
  iVar5 = divide_no_remainder<int>((int)uVar6,LVar2);
  Read<double>::Read(&local_3b0,(Read<double> *)local_178);
  Mesh::add_tag<double>((Mesh *)pAVar1,0,(string *)local_398,iVar5,&local_3b0,false);
  Read<double>::~Read(&local_3b0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"metric",&local_3d1);
  Mesh::remove_tag((Mesh *)pAVar1,0,(string *)local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"metric",&local_3f9);
  local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178;
  if (((ulong)local_178 & 1) == 0) {
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_178;
  }
  else {
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_178 >> 3);
  }
  uVar6 = (ulong)local_40._M_pi >> 3;
  local_68 = (Alloc *)local_a0._M_pi;
  local_48 = (Alloc *)local_a0._M_pi;
  LVar2 = Mesh::nverts((Mesh *)opts_local);
  iVar5 = divide_no_remainder<int>((int)uVar6,LVar2);
  Read<double>::Read(&local_410,(Read<double> *)local_178);
  Mesh::add_tag<double>((Mesh *)pAVar1,0,(string *)local_3f8,iVar5,&local_410,false);
  Read<double>::~Read(&local_410);
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  std::operator<<((ostream *)&std::cout,"limiting metric gradation\n");
  pAVar1 = opts_local;
  Read<double>::Read(&local_430,(Read<double> *)local_178);
  limit_metric_gradation((Omega_h *)&local_420,(Mesh *)pAVar1,&local_430,1.0,0.01,true);
  Read<double>::operator=((Read<double> *)local_178,&local_420);
  Read<double>::~Read(&local_420);
  Read<double>::~Read(&local_430);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"metric",&local_451);
  Mesh::remove_tag((Mesh *)pAVar1,0,(string *)local_450);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  pAVar1 = opts_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"metric",(allocator *)(local_4a0 + 0x27));
  mesh_local = (Mesh *)local_178;
  if (((ulong)local_178 & 1) == 0) {
    local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*(_func_int ***)local_178;
  }
  else {
    local_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)local_178 >> 3);
  }
  uVar6 = (ulong)local_50._M_pi >> 3;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)mesh_local;
  local_58 = mesh_local;
  LVar2 = Mesh::nverts((Mesh *)opts_local);
  iVar5 = divide_no_remainder<int>((int)uVar6,LVar2);
  Read<double>::Read((Read<double> *)(local_4a0 + 0x10),(Read<double> *)local_178);
  Mesh::add_tag<double>
            ((Mesh *)pAVar1,0,(string *)local_478,iVar5,(Read<double> *)(local_4a0 + 0x10),false);
  Read<double>::~Read((Read<double> *)(local_4a0 + 0x10));
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)(local_4a0 + 0x27));
  Mesh::ask_qualities((Mesh *)local_4a0);
  Read<double>::~Read((Read<double> *)local_4a0);
  std::operator<<((ostream *)&std::cout,"done with \"ill\" metric\n");
  compute_ill_metric_dim<2>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h_Isotropy)::
  {lambda(int)#1}::~Omega_h_Isotropy((_lambda_int__1_ *)local_2b0);
  Write<double>::~Write((Write<double> *)local_248);
  Read<double>::~Read((Read<double> *)local_208);
  Read<double>::~Read((Read<double> *)local_178);
  Read<double>::~Read((Read<double> *)local_108);
  return;
}

Assistant:

void compute_ill_metric_dim(
    Mesh* mesh, AdaptOpts const& opts, Omega_h_Isotropy isotropy) {
  mesh->remove_tag(VERT, "metric");
  std::cout << "getting element implied metrics\n";
  auto elem_metrics = get_element_implied_length_metrics(mesh);
  elem_metrics = apply_isotropy(mesh->nelems(), elem_metrics, isotropy);
  auto ncomps = divide_no_remainder(elem_metrics.size(), mesh->nelems());
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting them\n";
  auto metrics = project_metrics(mesh, elem_metrics);
  OMEGA_H_CHECK(ncomps == divide_no_remainder(metrics.size(), mesh->nverts()));
  if (isotropy == OMEGA_H_ANISOTROPIC) {
    for (Int i = 0; i < 5; ++i) {
      std::cout << "metric smoothing iteration " << i << '\n';
      metrics = smooth_metric_once(mesh, metrics, true);
    }
  }
  mesh->add_tag(VERT, "metric", ncomps, metrics);
  std::cout << "computing qualities\n";
  mesh->ask_qualities();
  auto prelim_quals = mesh->get_array<Real>(mesh->dim(), "quality");
  auto min_qual = opts.min_quality_allowed;
  std::cout << "removing low-quality contributions\n";
  auto elem_metrics_w = deep_copy(elem_metrics);
  auto f = OMEGA_H_LAMBDA(LO e) {
    if (prelim_quals[e] < min_qual) {
      for (Int i = 0; i < ncomps; ++i) {
        elem_metrics_w[e * ncomps + i] = 0.;
      }
    }
  };
  parallel_for(mesh->nelems(), f, "ignore_low_quality_implied");
  elem_metrics = Reals(elem_metrics_w);
  std::cout << "done removing low-quality contributions\n";
  mesh->remove_tag(dim, "metric");
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting metrics elem -> node\n";
  metrics = project_metrics(mesh, elem_metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  std::cout << "limiting metric gradation\n";
  metrics = limit_metric_gradation(mesh, metrics, 1.0);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->ask_qualities();
  std::cout << "done with \"ill\" metric\n";
}